

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_lod_invalid_lod
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  string shaderSource_03;
  string shaderSource_04;
  string shaderSource_05;
  string shaderSource_06;
  string shaderSource_07;
  string shaderSource_08;
  bool bVar2;
  ContextType ctxType;
  char *__s;
  long *plVar3;
  size_type *psVar4;
  DataType dataType;
  long lVar5;
  string shaderSource;
  DataType in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  _Alloc_hider _Var6;
  size_type sVar7;
  undefined8 in_stack_fffffffffffffe50;
  undefined8 uVar8;
  allocator<char> local_199;
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long local_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)0x2d,dataType);
    bVar2 = NegativeTestContext::isExtensionSupported(ctx,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      return;
    }
  }
  _Var6._M_p = &stack0xfffffffffffffe50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe40,"textureLod: Invalid lod type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffe40);
  if (_Var6._M_p != &stack0xfffffffffffffe50) {
    operator_delete(_Var6._M_p,in_stack_fffffffffffffe50 + 1);
  }
  lVar5 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar5];
    bVar2 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar2) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_199);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1c79853);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        uVar8 = *psVar4;
        _Var6._M_p = &stack0xfffffffffffffe50;
      }
      else {
        uVar8 = *psVar4;
        _Var6._M_p = (pointer)*plVar3;
      }
      sVar7 = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffe40);
      if (_Var6._M_p != &stack0xfffffffffffffe50) {
        operator_delete(_Var6._M_p,uVar8 + 1);
      }
      local_78 = lVar5;
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      lVar5 = 0;
      do {
        if (lVar5 != 0) {
          DVar1 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar5)
          ;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                    ((string *)&stack0xfffffffffffffe40,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2d,TYPE_FLOAT,DVar1,
                     in_stack_fffffffffffffe38);
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b8,_Var6._M_p,_Var6._M_p + sVar7);
          shaderSource_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
          shaderSource_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe38;
          shaderSource_00._M_string_length = (size_type)_Var6._M_p;
          shaderSource_00.field_2._M_allocated_capacity = sVar7;
          shaderSource_00.field_2._8_8_ = uVar8;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_b8[0],shaderSource_00);
          if (local_b8[0] != local_a8) {
            operator_delete(local_b8[0],local_a8[0] + 1);
          }
          if (_Var6._M_p != &stack0xfffffffffffffe50) {
            operator_delete(_Var6._M_p,uVar8 + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                    ((string *)&stack0xfffffffffffffe40,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3a,TYPE_FLOAT,DVar1,
                     in_stack_fffffffffffffe38);
          local_d8[0] = local_c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d8,_Var6._M_p,_Var6._M_p + sVar7);
          shaderSource_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
          shaderSource_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe38;
          shaderSource_01._M_string_length = (size_type)_Var6._M_p;
          shaderSource_01.field_2._M_allocated_capacity = sVar7;
          shaderSource_01.field_2._8_8_ = uVar8;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_d8[0],shaderSource_01);
          if (local_d8[0] != local_c8) {
            operator_delete(local_d8[0],local_c8[0] + 1);
          }
          if (_Var6._M_p != &stack0xfffffffffffffe50) {
            operator_delete(_Var6._M_p,uVar8 + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                    ((string *)&stack0xfffffffffffffe40,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x41,TYPE_FLOAT,DVar1,
                     in_stack_fffffffffffffe38);
          local_f8[0] = local_e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,_Var6._M_p,_Var6._M_p + sVar7);
          shaderSource_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
          shaderSource_02._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe38;
          shaderSource_02._M_string_length = (size_type)_Var6._M_p;
          shaderSource_02.field_2._M_allocated_capacity = sVar7;
          shaderSource_02.field_2._8_8_ = uVar8;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_f8[0],shaderSource_02);
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0],local_e8[0] + 1);
          }
          if (_Var6._M_p != &stack0xfffffffffffffe50) {
            operator_delete(_Var6._M_p,uVar8 + 1);
          }
        }
        DVar1 = *(DataType *)
                 ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes + lVar5);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                  ((string *)&stack0xfffffffffffffe40,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2d,TYPE_FLOAT_VEC4,DVar1,
                   in_stack_fffffffffffffe38);
        local_118[0] = local_108;
        std::__cxx11::string::_M_construct<char*>((string *)local_118,_Var6._M_p,_Var6._M_p + sVar7)
        ;
        shaderSource_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
        shaderSource_03._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe38;
        shaderSource_03._M_string_length = (size_type)_Var6._M_p;
        shaderSource_03.field_2._M_allocated_capacity = sVar7;
        shaderSource_03.field_2._8_8_ = uVar8;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_118[0],shaderSource_03);
        if (local_118[0] != local_108) {
          operator_delete(local_118[0],local_108[0] + 1);
        }
        if (_Var6._M_p != &stack0xfffffffffffffe50) {
          operator_delete(_Var6._M_p,uVar8 + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                  ((string *)&stack0xfffffffffffffe40,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3a,TYPE_FLOAT_VEC4,DVar1,
                   in_stack_fffffffffffffe38);
        local_138[0] = local_128;
        std::__cxx11::string::_M_construct<char*>((string *)local_138,_Var6._M_p,_Var6._M_p + sVar7)
        ;
        shaderSource_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
        shaderSource_04._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe38;
        shaderSource_04._M_string_length = (size_type)_Var6._M_p;
        shaderSource_04.field_2._M_allocated_capacity = sVar7;
        shaderSource_04.field_2._8_8_ = uVar8;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_138[0],shaderSource_04);
        if (local_138[0] != local_128) {
          operator_delete(local_138[0],local_128[0] + 1);
        }
        if (_Var6._M_p != &stack0xfffffffffffffe50) {
          operator_delete(_Var6._M_p,uVar8 + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                  ((string *)&stack0xfffffffffffffe40,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x41,TYPE_FLOAT_VEC4,DVar1,
                   in_stack_fffffffffffffe38);
        local_158[0] = local_148;
        std::__cxx11::string::_M_construct<char*>((string *)local_158,_Var6._M_p,_Var6._M_p + sVar7)
        ;
        shaderSource_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
        shaderSource_05._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe38;
        shaderSource_05._M_string_length = (size_type)_Var6._M_p;
        shaderSource_05.field_2._M_allocated_capacity = sVar7;
        shaderSource_05.field_2._8_8_ = uVar8;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_158[0],shaderSource_05);
        if (local_158[0] != local_148) {
          operator_delete(local_158[0],local_148[0] + 1);
        }
        if (_Var6._M_p != &stack0xfffffffffffffe50) {
          operator_delete(_Var6._M_p,uVar8 + 1);
        }
        DVar1 = *(DataType *)
                 ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes + lVar5);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                  ((string *)&stack0xfffffffffffffe40,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2d,TYPE_FLOAT_VEC4,DVar1,
                   in_stack_fffffffffffffe38);
        local_178[0] = local_168;
        std::__cxx11::string::_M_construct<char*>((string *)local_178,_Var6._M_p,_Var6._M_p + sVar7)
        ;
        shaderSource_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
        shaderSource_06._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe38;
        shaderSource_06._M_string_length = (size_type)_Var6._M_p;
        shaderSource_06.field_2._M_allocated_capacity = sVar7;
        shaderSource_06.field_2._8_8_ = uVar8;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_178[0],shaderSource_06);
        if (local_178[0] != local_168) {
          operator_delete(local_178[0],local_168[0] + 1);
        }
        if (_Var6._M_p != &stack0xfffffffffffffe50) {
          operator_delete(_Var6._M_p,uVar8 + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                  ((string *)&stack0xfffffffffffffe40,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3a,TYPE_FLOAT_VEC4,DVar1,
                   in_stack_fffffffffffffe38);
        local_198[0] = local_188;
        std::__cxx11::string::_M_construct<char*>((string *)local_198,_Var6._M_p,_Var6._M_p + sVar7)
        ;
        shaderSource_07._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
        shaderSource_07._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe38;
        shaderSource_07._M_string_length = (size_type)_Var6._M_p;
        shaderSource_07.field_2._M_allocated_capacity = sVar7;
        shaderSource_07.field_2._8_8_ = uVar8;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_198[0],shaderSource_07);
        if (local_198[0] != local_188) {
          operator_delete(local_198[0],local_188[0] + 1);
        }
        if (_Var6._M_p != &stack0xfffffffffffffe50) {
          operator_delete(_Var6._M_p,uVar8 + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                  ((string *)&stack0xfffffffffffffe40,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x41,TYPE_FLOAT_VEC4,DVar1,
                   in_stack_fffffffffffffe38);
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>((string *)local_98,_Var6._M_p,_Var6._M_p + sVar7);
        shaderSource_08._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe3c;
        shaderSource_08._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe38;
        shaderSource_08._M_string_length = (size_type)_Var6._M_p;
        shaderSource_08.field_2._M_allocated_capacity = sVar7;
        shaderSource_08.field_2._8_8_ = uVar8;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_98[0],shaderSource_08);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        if (_Var6._M_p != &stack0xfffffffffffffe50) {
          operator_delete(_Var6._M_p,uVar8 + 1);
        }
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar5 = local_78;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_lod_invalid_lod (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
	{
		ctx.beginSection("textureLod: Invalid lod type.");
		for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
		{
			if (ctx.isShaderSupported(s_shaders[shaderNdx]))
			{
				ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
					{
						{
							const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				ctx.endSection();
			}
		}
		ctx.endSection();
	}
}